

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFFLoader.h
# Opt level: O2

void __thiscall Assimp::NFFImporter::MeshInfo::MeshInfo(MeshInfo *this,MeshInfo *param_1)

{
  ShadingInfo::ShadingInfo(&this->shader,&param_1->shader);
  memcpy(&this->pType,&param_1->pType,0xac);
  (this->vertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (param_1->vertices).
       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->vertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (param_1->vertices).
       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->vertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->vertices).
       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (param_1->vertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->vertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->vertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->normals).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
  .super__Vector_impl_data._M_start =
       (param_1->normals).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->normals).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
  .super__Vector_impl_data._M_finish =
       (param_1->normals).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->normals).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage =
       (param_1->normals).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->normals).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->normals).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (param_1->normals).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->uvs).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start =
       (param_1->uvs).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->uvs).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (param_1->uvs).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (this->uvs).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (param_1->uvs).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->uvs).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->uvs).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->uvs).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->faces).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (param_1->faces).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->faces).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (param_1->faces).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->faces).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (param_1->faces).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (param_1->faces).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->faces).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (param_1->faces).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->colors).super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start =
       (param_1->colors).super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->colors).super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (param_1->colors).super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (this->colors).super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (param_1->colors).super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->colors).super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->colors).super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->colors).super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  this->matIndex = param_1->matIndex;
  return;
}

Assistant:

MeshInfo(PatchType _pType, bool bL = false)
            : pType     (_pType)
            , bLocked   (bL)
            , radius    (1.f,1.f,1.f)
            , dir       (0.f,1.f,0.f)
            , matIndex  (0)
        {
            name[0] = '\0'; // by default meshes are unnamed
        }